

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

int luaK_code(FuncState *fs,Instruction i)

{
  Proto *pPVar1;
  Instruction *pIVar2;
  int *piVar3;
  int iVar4;
  
  pPVar1 = fs->f;
  patchlistaux(fs,fs->jpc,fs->pc,0x7f,fs->pc);
  fs->jpc = -1;
  iVar4 = fs->pc;
  if (iVar4 < pPVar1->sizecode) {
    pIVar2 = pPVar1->code;
  }
  else {
    pIVar2 = (Instruction *)
             luaM_growaux_(fs->ls->L,pPVar1->code,&pPVar1->sizecode,4,0x7fffffff,"opcodes");
    pPVar1->code = pIVar2;
    iVar4 = fs->pc;
  }
  pIVar2[iVar4] = i;
  if (((byte)ravi_parser_debug & 2) != 0) {
    raviY_printf(fs,"[%d] %o\n",(ulong)(uint)fs->pc,i);
  }
  iVar4 = fs->pc;
  if (iVar4 < pPVar1->sizelineinfo) {
    piVar3 = pPVar1->lineinfo;
  }
  else {
    piVar3 = (int *)luaM_growaux_(fs->ls->L,pPVar1->lineinfo,&pPVar1->sizelineinfo,4,0x7fffffff,
                                  "opcodes");
    pPVar1->lineinfo = piVar3;
    iVar4 = fs->pc;
  }
  piVar3[iVar4] = fs->ls->lastline;
  iVar4 = fs->pc;
  fs->pc = iVar4 + 1;
  return iVar4;
}

Assistant:

static int luaK_code (FuncState *fs, Instruction i) {
  Proto *f = fs->f;
  dischargejpc(fs);  /* 'pc' will change */
  /* put new instruction in code array */
  luaM_growvector(fs->ls->L, f->code, fs->pc, f->sizecode, Instruction,
                  MAX_INT, "opcodes");
  f->code[fs->pc] = i;
  DEBUG_CODEGEN(raviY_printf(fs, "[%d] %o\n", fs->pc, i));
  /* save corresponding line information */
  luaM_growvector(fs->ls->L, f->lineinfo, fs->pc, f->sizelineinfo, int,
                  MAX_INT, "opcodes");
  f->lineinfo[fs->pc] = fs->ls->lastline;
  return fs->pc++;
}